

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O1

bool QtPrivate::QTypeNormalizer::skipToken(char **x,char *e,char *token,bool msvcKw)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  byte *pbVar4;
  char *pcVar5;
  
  bVar2 = starts_with_token(*x,e,token,msvcKw);
  if (bVar2) {
    if (*token != '\0') {
      pcVar3 = *x;
      pcVar5 = token + 1;
      do {
        pcVar3 = pcVar3 + 1;
        *x = pcVar3;
        cVar1 = *pcVar5;
        pcVar5 = pcVar5 + 1;
      } while (cVar1 != '\0');
    }
    pbVar4 = (byte *)*x;
    while (((pbVar4 != (byte *)e && ((ulong)*pbVar4 < 0x21)) &&
           ((0x100000600U >> ((ulong)*pbVar4 & 0x3f) & 1) != 0))) {
      pbVar4 = pbVar4 + 1;
      *x = (char *)pbVar4;
    }
  }
  return bVar2;
}

Assistant:

static constexpr bool skipToken(const char *&x, const char *e, const char *token,
                                    bool msvcKw = false)
    {
        if (!starts_with_token(x, e, token, msvcKw))
            return false;
        while (*token++)
            x++;
        while (x != e && is_space(*x))
            x++;
        return true;
    }